

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

void inner_update_cb_post(update_data *d,float x,float *wref)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar4 = ABS(x);
  fVar1 = d->update;
  fVar2 = wref[3];
  fVar3 = fVar1;
  if (wref[3] < fVar4) {
    wref[3] = fVar4;
    fVar3 = d->update;
    fVar2 = fVar4;
  }
  fVar3 = ABS(fVar3);
  fVar4 = wref[5];
  if (fVar4 < fVar3) {
    fVar4 = fVar3;
    if (fVar3 <= d->ftrl_beta) {
      fVar4 = d->ftrl_beta;
    }
    wref[5] = fVar4;
  }
  fVar4 = fVar4 * fVar2;
  fVar3 = 0.0;
  if (fVar4 <= 0.0) {
    fVar6 = wref[1];
    fVar5 = wref[2];
    fVar2 = wref[4];
  }
  else {
    fVar2 = wref[4];
    fVar6 = wref[1];
    fVar5 = wref[2];
    fVar3 = ((d->ftrl_alpha + fVar2) * fVar6) / ((fVar4 + fVar5) * fVar4);
  }
  *wref = fVar3;
  fVar1 = fVar1 * x;
  wref[1] = fVar6 - fVar1;
  wref[2] = ABS(fVar1) + fVar5;
  wref[4] = fVar2 - fVar1 * fVar3;
  return;
}

Assistant:

void inner_update_cb_post(update_data& d, float x, float& wref)
{
  float* w = &wref;
  float fabs_x = fabs(x);
  float gradient = d.update * x;

  if (fabs_x > w[W_MX]) {
    w[W_MX] = fabs_x;
  }

  float fabs_gradient = fabs(d.update);
  if (fabs_gradient > w[W_MG])
    w[W_MG] = fabs_gradient>d.ftrl_beta?fabs_gradient:d.ftrl_beta;

  // COCOB update without sigmoid.
  // If a new Lipschitz constant and/or magnitude of x is found, the w is
  // recalculated and used in the update of the wealth below.
  if (w[W_MG]*w[W_MX]>0)
    w[W_XT] = (d.ftrl_alpha+w[W_WE]) * w[W_ZT]/(w[W_MG]*w[W_MX]*(w[W_MG]*w[W_MX]+w[W_G2]));
  else
    w[W_XT] = 0;

  w[W_ZT] += -gradient;
  w[W_G2] += fabs(gradient);
  w[W_WE] += (-gradient*w[W_XT]);
}